

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O0

void __thiscall QNumberStyleAnimation::~QNumberStyleAnimation(QNumberStyleAnimation *this)

{
  void *in_RDI;
  
  ~QNumberStyleAnimation((QNumberStyleAnimation *)0x4c795c);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QNumberStyleAnimation : public QStyleAnimation
{
    Q_OBJECT

public:
    QNumberStyleAnimation(QObject *target);

    qreal startValue() const;
    void setStartValue(qreal value);

    qreal endValue() const;
    void setEndValue(qreal value);

    qreal currentValue() const;

protected:
    bool isUpdateNeeded() const override;

private:
    qreal _start;
    qreal _end;
    mutable qreal _prev;
}